

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vup(DisasContext_conflict13 *s,DisasOps *o)

{
  MemOp_conflict MVar1;
  TCGContext_conflict12 *tcg_ctx;
  uint uVar2;
  int iVar3;
  MemOp_conflict MVar4;
  MemOp_conflict MVar5;
  TCGv_i64 dst;
  DisasJumpType DVar6;
  MemOp_conflict MVar7;
  uint uVar8;
  uint8_t local_44;
  
  uVar8 = *(uint *)&(s->fields).field_0x8;
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
  iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
  DVar6 = DISAS_NORETURN;
  MVar4 = get_field1(s,FLD_O_m3,FLD_C_i3);
  MVar5 = MVar4 & 0xff;
  if (MVar5 < MO_64) {
    MVar7 = (uint)((uVar8 & 0xfe00) != 0xd400) << 2;
    MVar1 = MVar4 + MO_16;
    dst = tcg_temp_new_i64(tcg_ctx);
    local_44 = (uint8_t)iVar3;
    if (((s->fields).field_0x9 | 2) == 0xd7) {
      uVar8 = 0x10 >> ((byte)MVar1 & 0x1f);
      while (0 < (int)uVar8) {
        uVar8 = uVar8 - 1;
        read_vec_element_i64(tcg_ctx,dst,local_44,(uint8_t)uVar8,MVar5 | MVar7);
        write_vec_element_i64(tcg_ctx,dst,uVar2 & 0xff,(uint8_t)uVar8,MVar1 & 0xff);
      }
    }
    else {
      for (uVar8 = 0; 0x10U >> ((byte)MVar1 & 0x1f) != uVar8; uVar8 = uVar8 + 1) {
        read_vec_element_i64
                  (tcg_ctx,dst,local_44,(char)(8 >> ((byte)MVar4 & 0x1f)) + (uint8_t)uVar8,
                   MVar5 | MVar7);
        write_vec_element_i64(tcg_ctx,dst,uVar2 & 0xff,(uint8_t)uVar8,MVar1 & 0xff);
      }
    }
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    DVar6 = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
  }
  return DVar6;
}

Assistant:

static DisasJumpType op_vup(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const bool logical = s->fields.op2 == 0xd4 || s->fields.op2 == 0xd5;
    const uint8_t v1 = get_field(s, v1);
    const uint8_t v2 = get_field(s, v2);
    const uint8_t src_es = get_field(s, m3);
    const uint8_t dst_es = src_es + 1;
    int dst_idx, src_idx;
    TCGv_i64 tmp;

    if (src_es > ES_32) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    if (s->fields.op2 == 0xd7 || s->fields.op2 == 0xd5) {
        /* iterate backwards to avoid overwriting data we might need later */
        for (dst_idx = NUM_VEC_ELEMENTS(dst_es) - 1; dst_idx >= 0; dst_idx--) {
            src_idx = dst_idx;
            read_vec_element_i64(tcg_ctx, tmp, v2, src_idx,
                                 src_es | (logical ? 0 : MO_SIGN));
            write_vec_element_i64(tcg_ctx, tmp, v1, dst_idx, dst_es);
        }

    } else {
        /* iterate forward to avoid overwriting data we might need later */
        for (dst_idx = 0; dst_idx < NUM_VEC_ELEMENTS(dst_es); dst_idx++) {
            src_idx = dst_idx + NUM_VEC_ELEMENTS(src_es) / 2;
            read_vec_element_i64(tcg_ctx, tmp, v2, src_idx,
                                 src_es | (logical ? 0 : MO_SIGN));
            write_vec_element_i64(tcg_ctx, tmp, v1, dst_idx, dst_es);
        }
    }
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}